

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O1

void * decrypt_thread(void *pargs)

{
  int iVar1;
  ssize_t sVar2;
  size_t length;
  long lVar3;
  ulong uVar4;
  sha256_context *psVar5;
  sha256_context *psVar6;
  long lVar7;
  size_t ilen;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint8_t hash [32];
  uint8_t iv [16];
  uint8_t next_iv [16];
  sha256_context ctx;
  sha256_context tmp;
  aes_context aes;
  uint8_t buffer [32800];
  uchar local_8288;
  uchar uStack_8287;
  uchar uStack_8286;
  uchar uStack_8285;
  uchar uStack_8284;
  uchar uStack_8283;
  uchar uStack_8282;
  uchar uStack_8281;
  uchar uStack_8280;
  uchar uStack_827f;
  uchar uStack_827e;
  uchar uStack_827d;
  uchar uStack_827c;
  uchar uStack_827b;
  uchar uStack_827a;
  uchar uStack_8279;
  uchar local_8278;
  uchar uStack_8277;
  uchar uStack_8276;
  uchar uStack_8275;
  uchar uStack_8274;
  uchar uStack_8273;
  uchar uStack_8272;
  uchar uStack_8271;
  uchar uStack_8270;
  uchar uStack_826f;
  uchar uStack_826e;
  uchar uStack_826d;
  uchar uStack_826c;
  uchar uStack_826b;
  uchar uStack_826a;
  uchar uStack_8269;
  undefined8 local_8268;
  undefined8 uStack_8260;
  undefined8 local_8258;
  undefined8 uStack_8250;
  sha256_context local_8248;
  sha256_context local_81e0;
  aes_context local_8178;
  uchar local_8058 [32768];
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  bVar8 = 0;
  lVar7 = 0x10;
  sVar2 = read_block(*pargs,&local_8268,0x10);
  if (sVar2 < 0x10) {
    decrypt_thread_cold_3();
  }
  else {
    aes_init_dec(&local_8178,(uint8_t *)((long)pargs + 8),0x100);
    sha256_init(&local_8248);
    sha256_starts(&local_8248);
    length = read_block(*pargs,local_8058,0x8020);
    if (0 < (long)length) {
      lVar7 = 0x10;
      do {
        local_8258 = *(undefined8 *)(local_8058 + (length - 0x10));
        uStack_8250 = *(undefined8 *)(local_8058 + (length - 8));
        aes_cbc_decrypt(&local_8178,(uint8_t *)&local_8268,local_8058,length,local_8058);
        if (length != 0x8020) {
          lVar7 = lVar7 + length;
          break;
        }
        sha256_update(&local_8248,local_8058,0x8000);
        sha256_copy(&local_81e0,&local_8248);
        sha256_final(&local_81e0,&local_8288);
        auVar11[0] = -(local_48 == local_8278);
        auVar11[1] = -(uStack_47 == uStack_8277);
        auVar11[2] = -(uStack_46 == uStack_8276);
        auVar11[3] = -(uStack_45 == uStack_8275);
        auVar11[4] = -(uStack_44 == uStack_8274);
        auVar11[5] = -(uStack_43 == uStack_8273);
        auVar11[6] = -(uStack_42 == uStack_8272);
        auVar11[7] = -(uStack_41 == uStack_8271);
        auVar11[8] = -(uStack_40 == uStack_8270);
        auVar11[9] = -(uStack_3f == uStack_826f);
        auVar11[10] = -(uStack_3e == uStack_826e);
        auVar11[0xb] = -(uStack_3d == uStack_826d);
        auVar11[0xc] = -(uStack_3c == uStack_826c);
        auVar11[0xd] = -(uStack_3b == uStack_826b);
        auVar11[0xe] = -(uStack_3a == uStack_826a);
        auVar11[0xf] = -(uStack_39 == uStack_8269);
        auVar9[0] = -(local_58 == local_8288);
        auVar9[1] = -(uStack_57 == uStack_8287);
        auVar9[2] = -(uStack_56 == uStack_8286);
        auVar9[3] = -(uStack_55 == uStack_8285);
        auVar9[4] = -(uStack_54 == uStack_8284);
        auVar9[5] = -(uStack_53 == uStack_8283);
        auVar9[6] = -(uStack_52 == uStack_8282);
        auVar9[7] = -(uStack_51 == uStack_8281);
        auVar9[8] = -(uStack_50 == uStack_8280);
        auVar9[9] = -(uStack_4f == uStack_827f);
        auVar9[10] = -(uStack_4e == uStack_827e);
        auVar9[0xb] = -(uStack_4d == uStack_827d);
        auVar9[0xc] = -(uStack_4c == uStack_827c);
        auVar9[0xd] = -(uStack_4b == uStack_827b);
        auVar9[0xe] = -(uStack_4a == uStack_827a);
        auVar9[0xf] = -(uStack_49 == uStack_8279);
        auVar9 = auVar9 & auVar11;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
          decrypt_thread_cold_1();
          goto LAB_00102954;
        }
        write_block(*(int *)((long)pargs + 4),local_8058,0x8000);
        local_8268 = local_8258;
        uStack_8260 = uStack_8250;
        lVar7 = lVar7 + 0x8020;
        length = read_block(*pargs,local_8058,0x8020);
      } while (0 < (long)length);
    }
    if ((long)length < 0) {
      decrypt_thread_cold_2();
    }
    else {
      lVar3 = *(long *)(local_8058 + (length - 8));
      if (lVar3 == lVar7) {
        iVar1 = *(int *)(local_8058 + (length - 0x10));
        if ((long)(ulong)(iVar1 + 0x30) <= (long)length) {
          uVar4 = (ulong)(iVar1 + 0x10);
          ilen = (length - 0x20) - uVar4;
          sha256_update(&local_8248,local_8058,ilen);
          psVar5 = &local_8248;
          psVar6 = &local_81e0;
          for (lVar3 = 0x1a; lVar3 != 0; lVar3 = lVar3 + -1) {
            psVar6->total[0] = psVar5->total[0];
            psVar5 = (sha256_context *)((long)psVar5 + (ulong)bVar8 * -8 + 4);
            psVar6 = (sha256_context *)((long)psVar6 + (ulong)bVar8 * -8 + 4);
          }
          sha256_final(&local_81e0,&local_8288);
          auVar12[0] = -(local_8058[ilen + 0x10] == local_8278);
          auVar12[1] = -(local_8058[ilen + 0x11] == uStack_8277);
          auVar12[2] = -(local_8058[ilen + 0x12] == uStack_8276);
          auVar12[3] = -(local_8058[ilen + 0x13] == uStack_8275);
          auVar12[4] = -(local_8058[ilen + 0x14] == uStack_8274);
          auVar12[5] = -(local_8058[ilen + 0x15] == uStack_8273);
          auVar12[6] = -(local_8058[ilen + 0x16] == uStack_8272);
          auVar12[7] = -(local_8058[ilen + 0x17] == uStack_8271);
          auVar12[8] = -(local_8058[ilen + 0x18] == uStack_8270);
          auVar12[9] = -(local_8058[ilen + 0x19] == uStack_826f);
          auVar12[10] = -(local_8058[ilen + 0x1a] == uStack_826e);
          auVar12[0xb] = -(local_8058[ilen + 0x1b] == uStack_826d);
          auVar12[0xc] = -(local_8058[ilen + 0x1c] == uStack_826c);
          auVar12[0xd] = -(local_8058[ilen + 0x1d] == uStack_826b);
          auVar12[0xe] = -(local_8058[ilen + 0x1e] == uStack_826a);
          auVar12[0xf] = -(local_8058[ilen + 0x1f] == uStack_8269);
          auVar10[0] = -(local_8058[ilen] == local_8288);
          auVar10[1] = -(local_8058[ilen + 1] == uStack_8287);
          auVar10[2] = -(local_8058[ilen + 2] == uStack_8286);
          auVar10[3] = -(local_8058[ilen + 3] == uStack_8285);
          auVar10[4] = -(local_8058[ilen + 4] == uStack_8284);
          auVar10[5] = -(local_8058[ilen + 5] == uStack_8283);
          auVar10[6] = -(local_8058[ilen + 6] == uStack_8282);
          auVar10[7] = -(local_8058[ilen + 7] == uStack_8281);
          auVar10[8] = -(local_8058[ilen + 8] == uStack_8280);
          auVar10[9] = -(local_8058[ilen + 9] == uStack_827f);
          auVar10[10] = -(local_8058[ilen + 10] == uStack_827e);
          auVar10[0xb] = -(local_8058[ilen + 0xb] == uStack_827d);
          auVar10[0xc] = -(local_8058[ilen + 0xc] == uStack_827c);
          auVar10[0xd] = -(local_8058[ilen + 0xd] == uStack_827b);
          auVar10[0xe] = -(local_8058[ilen + 0xe] == uStack_827a);
          auVar10[0xf] = -(local_8058[ilen + 0xf] == uStack_8279);
          auVar10 = auVar10 & auVar12;
          if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
            write_block(*(int *)((long)pargs + 4),local_8058,ilen);
          }
          else {
            fprintf(_stderr,"hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n",
                    ((lVar7 + length) - uVar4) + -0x20,length);
            print_hash("expected",local_8058 + (length - 0x20));
            print_hash("actual",&local_8288);
          }
        }
      }
      else {
        fprintf(_stderr,"read size mismatch. expected: 0x%llx, actual: 0x%zx\n",lVar3,lVar7);
      }
    }
  }
LAB_00102954:
  close(*(int *)((long)pargs + 4));
  close(*pargs);
  return (void *)0x0;
}

Assistant:

void *decrypt_thread(void *pargs) {
  args_t *args = (args_t *)pargs;
  sha256_context ctx, tmp;
  aes_context aes;
  uint8_t iv[AES_BLOCK_SIZE];
  uint8_t next_iv[AES_BLOCK_SIZE];
  uint8_t hash[SHA256_BLOCK_SIZE];
  uint8_t buffer[PSVIMG_BLOCK_SIZE + SHA256_BLOCK_SIZE];
  ssize_t rd, total;

  // read iv
  if (read_block(args->in, iv, AES_BLOCK_SIZE) < AES_BLOCK_SIZE) {
    fprintf(stderr, "file too small! cannot read IV!\n");
    goto end;
  }

  // decrypt blocks
  aes_init_dec(&aes, args->key, 256);
  sha256_init(&ctx);
  sha256_starts(&ctx);
  total = AES_BLOCK_SIZE;
  while ((rd = read_block(args->in, buffer, sizeof(buffer))) > 0) {
    // save next iv
    memcpy(next_iv, &buffer[rd - AES_BLOCK_SIZE], AES_BLOCK_SIZE);

    // decrypt
    aes_cbc_decrypt(&aes, iv, buffer, rd, buffer);

    if (rd != sizeof(buffer)) {
      total += rd;
      break; // last block requires special processing
    }

    // TODO: there's actually a bug in Sony's implementation where 
    // if the last block is exactly 0x8000 (before the SHA256) then 
    // it won't know about the last block and terminate in error. 
    // In other words, we don't have to handle this edge case... for now.

    // validate hash
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE);
    sha256_copy(&tmp, &ctx);
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%zx, (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }

    // write output
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE);

    memcpy(iv, next_iv, AES_BLOCK_SIZE);
    total += rd;
  }

  if (rd < 0) {
    fprintf(stderr, "Read error occured!\n");
    goto end;
  }

  // handle last block specially
  uint64_t exp_total;
  uint32_t exp_padding;

  exp_padding = le32toh(*(uint32_t *)&buffer[rd-0x10]);
  exp_total = le64toh(*(uint64_t *)&buffer[rd-0x8]);
  if (exp_total != total) {
    fprintf(stderr, "read size mismatch. expected: 0x%llx, actual: 0x%zx\n", exp_total, total);
    goto end;
  }
  exp_padding += 0x10;
  if (rd >= SHA256_BLOCK_SIZE + exp_padding) {
    sha256_update(&ctx, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
    tmp = ctx;
    sha256_final(&tmp, hash);
    if (memcmp(&buffer[rd-SHA256_BLOCK_SIZE-exp_padding], hash, SHA256_BLOCK_SIZE) != 0) {
      fprintf(stderr, "hash mismatch at offset 0x%lx (final block), (buffer size 0x%zx)\n", total + rd - SHA256_BLOCK_SIZE - exp_padding, rd);
      print_hash("expected", &buffer[rd-SHA256_BLOCK_SIZE]);
      print_hash("actual", hash);
      goto end;
    }
    write_block(args->out, buffer, rd - SHA256_BLOCK_SIZE - exp_padding);
  }

end:
  close(args->out);
  close(args->in);
  return NULL;
}